

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.c
# Opt level: O2

void OnUpdate(GLContext *info)

{
  nk_context *ctx;
  MousePos pos;
  _Bool _Var1;
  uint8_t uVar2;
  nk_bool nVar3;
  void *pvVar4;
  uint uVar5;
  nk_rect bounds;
  int height;
  int width;
  undefined1 auStack_2c [12];
  
  (*glad_glClear)(0x4100);
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  BindShader(&info->basicShaderId);
  _Var1 = IsMousePressed(0);
  if (_Var1) {
    glfwGetCursorPos(info->window,(double *)&width,(double *)(auStack_2c + 4));
    pvVar4 = glfwGetWindowUserPointer(info->window);
    pos._4_12_ = auStack_2c;
    pos.x._0_4_ = width;
    OnGamefieldClick(*(Gamefield **)((long)pvVar4 + 0x18),pos);
  }
  BindGamefield(0,info->gamefield);
  OnUpdateGamefield(info->gamefield);
  BindVertexArray(&info->vertexArrayId);
  (*glad_glDrawElements)(4,0x18,0x1405,(void *)0x0);
  UnBindGamefield(info->gamefield);
  nk_glfw3_new_frame(info->glfw);
  ctx = info->guiContext;
  bounds = nk_rect(0.0,0.0,250.0,250.0);
  nVar3 = nk_begin(ctx,"Controls",bounds,0x41);
  if (nVar3 != 0) {
    nk_layout_row_static(info->guiContext,20.0,100,1);
    nk_label(info->guiContext,"Pixel types:",1);
    nk_layout_row_dynamic(info->guiContext,30.0,2);
    nVar3 = nk_option_label(info->guiContext,"Sand",(uint)(OnUpdate::pixelType == 0));
    if (nVar3 == 0) {
      uVar5 = (uint)(OnUpdate::pixelType == 1);
    }
    else {
      OnUpdate::pixelType = 0;
      uVar5 = 0;
    }
    nVar3 = nk_option_label(info->guiContext,"Water",uVar5);
    if (nVar3 == 0) {
      uVar5 = (uint)(OnUpdate::pixelType == 6);
    }
    else {
      OnUpdate::pixelType = 1;
      uVar5 = 0;
    }
    nVar3 = nk_option_label(info->guiContext,"Fire",uVar5);
    if (nVar3 == 0) {
      uVar5 = (uint)(OnUpdate::pixelType == 5);
    }
    else {
      OnUpdate::pixelType = 6;
      uVar5 = 0;
    }
    nVar3 = nk_option_label(info->guiContext,"Smoke",uVar5);
    if (nVar3 == 0) {
      uVar5 = (uint)(OnUpdate::pixelType == 4);
    }
    else {
      OnUpdate::pixelType = 5;
      uVar5 = 0;
    }
    nVar3 = nk_option_label(info->guiContext,"Plant",uVar5);
    if (nVar3 == 0) {
      uVar5 = (uint)(OnUpdate::pixelType == 3);
    }
    else {
      OnUpdate::pixelType = 4;
      uVar5 = 0;
    }
    nVar3 = nk_option_label(info->guiContext,"Stone",uVar5);
    if (nVar3 != 0) {
      OnUpdate::pixelType = 3;
    }
    SetCurrentPixelType(OnUpdate::pixelType);
    nk_layout_row_static(info->guiContext,20.0,0x32,3);
    nVar3 = nk_button_label(info->guiContext,"Clear");
    if (nVar3 != 0) {
      ClearGamefield(info->gamefield);
    }
    nk_layout_row_static(info->guiContext,20.0,100,1);
    nk_label(info->guiContext,"Brush size:",1);
    nk_layout_row_static(info->guiContext,20.0,0x32,2);
    nVar3 = nk_button_label(info->guiContext,"-");
    if ((nVar3 != 0) && (uVar2 = GetCurrentPixelsRadius(), uVar2 != '\0')) {
      uVar2 = GetCurrentPixelsRadius();
      SetPixelsRadius(uVar2 + 0xff);
    }
    nVar3 = nk_button_label(info->guiContext,"+");
    if ((nVar3 != 0) && (uVar2 = GetCurrentPixelsRadius(), uVar2 != 0xff)) {
      uVar2 = GetCurrentPixelsRadius();
      SetPixelsRadius(uVar2 + '\x01');
    }
  }
  nk_end(info->guiContext);
  glfwGetWindowSize(info->window,&width,&height);
  (*glad_glViewport)(0,0,width,height);
  nVar3 = nk_item_is_any_active(info->guiContext);
  SetUiUse(nVar3 != 0);
  glfwPollEvents();
  nk_glfw3_render(info->glfw,NK_ANTI_ALIASING_ON,0x200000,0x80000);
  glfwSwapBuffers(info->window);
  return;
}

Assistant:

void OnUpdate(struct GLContext const* info) {
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
    glClearColor(0, 0, 0, 1);
    struct nk_colorf bg;
    bg.r = 0.10f, bg.g = 0.18f, bg.b = 0.24f, bg.a = 1.0f;

    BindShader(&info->basicShaderId);
    bool isLeftButtonPressed = IsMousePressed(GLFW_MOUSE_BUTTON_1);
    if (isLeftButtonPressed) {
        MousePos pos;
        struct GLContext* context;
        glfwGetCursorPos(info->window, &pos.x, &pos.y);
        context = glfwGetWindowUserPointer(info->window);
        OnGamefieldClick(context->gamefield, pos);
    }
    BindGamefield(0, info->gamefield);
    OnUpdateGamefield(info->gamefield);
    BindVertexArray(&info->vertexArrayId);

    glDrawElements(GL_TRIANGLES, 24, GL_UNSIGNED_INT, NULL);
    UnBindGamefield(info->gamefield);

    nk_glfw3_new_frame(info->glfw);
    static int pixelType;
    if (nk_begin(info->guiContext, "Controls", nk_rect(0, 0, 250, 250),
                 NK_WINDOW_BORDER | NK_WINDOW_TITLE)) {

        nk_layout_row_static(info->guiContext, 20, 100, 1);
        nk_label(info->guiContext, "Pixel types:", NK_TEXT_ALIGN_LEFT);

        nk_layout_row_dynamic(info->guiContext, 30, 2);
        if (nk_option_label(info->guiContext, "Sand", pixelType == Sand)) pixelType = Sand;
        if (nk_option_label(info->guiContext, "Water", pixelType == Water)) pixelType = Water;
        if (nk_option_label(info->guiContext, "Fire", pixelType == Fire)) pixelType = Fire;
        if (nk_option_label(info->guiContext, "Smoke", pixelType == Smoke)) pixelType = Smoke;
        if (nk_option_label(info->guiContext, "Plant", pixelType == Plant)) pixelType = Plant;
        if (nk_option_label(info->guiContext, "Stone", pixelType == Stone)) pixelType = Stone;
        SetCurrentPixelType(pixelType);

        nk_layout_row_static(info->guiContext, 20, 50, 3);
        if (nk_button_label(info->guiContext, "Clear")) {
            ClearGamefield(info->gamefield);
        }

        nk_layout_row_static(info->guiContext, 20, 100, 1);
        nk_label(info->guiContext, "Brush size:", NK_TEXT_ALIGN_LEFT);

        nk_layout_row_static(info->guiContext, 20, 50, 2);
        if (nk_button_label(info->guiContext, "-")) {
            if (GetCurrentPixelsRadius() > 0) {
                SetPixelsRadius(GetCurrentPixelsRadius() - 1);
            }
        }
        if (nk_button_label(info->guiContext, "+")) {
            if (GetCurrentPixelsRadius() < UINT8_MAX) {
                SetPixelsRadius(GetCurrentPixelsRadius() + 1);
            }
        }
    }

    nk_end(info->guiContext);

    int width, height;
    glfwGetWindowSize(info->window, &width, &height);
    glViewport(0, 0, width, height);
    SetUiUse(nk_item_is_any_active(info->guiContext));
    glfwPollEvents();
    nk_glfw3_render(info->glfw, NK_ANTI_ALIASING_ON, MAX_VERTEX_BUFFER, MAX_ELEMENT_BUFFER);
    glfwSwapBuffers(info->window);
}